

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorBuilder::~DescriptorBuilder(DescriptorBuilder *this)

{
  pointer pcVar1;
  pointer pOVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pOVar5;
  
  pcVar1 = (this->possible_undeclared_dependency_name_)._M_dataplus._M_p;
  paVar4 = &(this->possible_undeclared_dependency_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&(this->dependencies_)._M_t);
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  paVar4 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pOVar5 = (this->options_to_interpret_).
           super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->options_to_interpret_).
           super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar5 != pOVar2) {
    paVar4 = &(pOVar5->element_name).field_2;
    do {
      plVar3 = (long *)(((string *)(paVar4 + -1))->_M_dataplus)._M_p;
      if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar3) {
        operator_delete(plVar3,paVar4->_M_allocated_capacity + 1);
      }
      if (paVar4 + -2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)paVar4[-3]._M_allocated_capacity) {
        operator_delete((long *)paVar4[-3]._M_allocated_capacity,
                        paVar4[-2]._M_allocated_capacity + 1);
      }
      pOVar5 = (pointer)(paVar4 + 2);
      paVar4 = paVar4 + 5;
    } while (pOVar5 != pOVar2);
    pOVar5 = (this->options_to_interpret_).
             super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pOVar5 != (pointer)0x0) {
    operator_delete(pOVar5,(long)(this->options_to_interpret_).
                                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pOVar5);
    return;
  }
  return;
}

Assistant:

DescriptorBuilder::~DescriptorBuilder() {}